

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprFor * AnalyzeFor(ExpressionContext *ctx,SynFor *syntax)

{
  undefined4 uVar1;
  undefined4 uVar2;
  SynBlock *syntax_00;
  ScopeData *pSVar3;
  TypeBase *pTVar4;
  int iVar5;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var_00;
  ExprBase *pEVar8;
  undefined4 extraout_var_01;
  SynBase *source;
  FunctionData *onwerFunction;
  ExprBase *node;
  undefined4 extraout_var_02;
  ExprFor *pEVar9;
  ExpressionContext *this;
  ExprBlock *local_58;
  IntrusiveList<ExprBase> iteration;
  undefined4 extraout_var_03;
  
  ExpressionContext::PushLoopScope(ctx,false,false);
  syntax_00 = (SynBlock *)syntax->initializer;
  if (syntax_00 == (SynBlock *)0x0) {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    local_58 = (ExprBlock *)CONCAT44(extraout_var,iVar5);
    pTVar4 = ctx->typeVoid;
    (local_58->super_ExprBase).typeID = 2;
    (local_58->super_ExprBase).source = &syntax->super_SynBase;
    (local_58->super_ExprBase).type = pTVar4;
    (local_58->super_ExprBase).next = (ExprBase *)0x0;
    (local_58->super_ExprBase).listed = false;
    (local_58->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240668;
  }
  else if ((syntax_00->super_SynBase).typeID == 0x26) {
    local_58 = AnalyzeBlock(ctx,syntax_00,false);
  }
  else {
    local_58 = (ExprBlock *)AnalyzeStatement(ctx,(SynBase *)syntax_00);
  }
  pEVar6 = AnalyzeExpression(ctx,syntax->condition);
  pEVar6 = CreateConditionCast(ctx,pEVar6->source,pEVar6);
  pSVar3 = ctx->scope;
  uVar1 = pSVar3->breakDepth;
  uVar2 = pSVar3->contiueDepth;
  pSVar3->breakDepth = uVar1 + 1;
  pSVar3->contiueDepth = uVar2 + 1;
  if (syntax->increment == (SynBase *)0x0) {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar5);
    pTVar4 = ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = &syntax->super_SynBase;
    pEVar7->type = pTVar4;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240668;
  }
  else {
    pEVar7 = AnalyzeStatement(ctx,syntax->increment);
  }
  if (syntax->body == (SynBase *)0x0) {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_01,iVar5);
    pTVar4 = ctx->typeVoid;
    pEVar8->typeID = 2;
    pEVar8->source = &syntax->super_SynBase;
    pEVar8->type = pTVar4;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240668;
  }
  else {
    pEVar8 = AnalyzeStatement(ctx,syntax->body);
  }
  iteration.head = (ExprBase *)0x0;
  iteration.tail = (ExprBase *)0x0;
  this = ctx;
  source = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  pSVar3 = ctx->scope;
  onwerFunction = ExpressionContext::GetCurrentFunction(this,pSVar3);
  node = CreateBlockUpvalueClose(ctx,source,onwerFunction,pSVar3);
  if (node != (ExprBase *)0x0) {
    IntrusiveList<ExprBase>::push_back(&iteration,node);
  }
  IntrusiveList<ExprBase>::push_back(&iteration,pEVar7);
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar7 = (ExprBase *)CONCAT44(extraout_var_02,iVar5);
  pTVar4 = ctx->typeVoid;
  pEVar7->typeID = 0x36;
  pEVar7->source = &syntax->super_SynBase;
  pEVar7->type = pTVar4;
  pEVar7->next = (ExprBase *)0x0;
  pEVar7->listed = false;
  pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002410a0;
  pEVar7[1]._vptr_ExprBase = (_func_int **)iteration.head;
  *(ExprBase **)&pEVar7[1].typeID = iteration.tail;
  pEVar7[1].source = (SynBase *)0x0;
  ExpressionContext::PopScope(ctx,SCOPE_LOOP);
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  pEVar9 = (ExprFor *)CONCAT44(extraout_var_03,iVar5);
  pTVar4 = ctx->typeVoid;
  (pEVar9->super_ExprBase).typeID = 0x30;
  (pEVar9->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar9->super_ExprBase).type = pTVar4;
  (pEVar9->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar9->super_ExprBase).listed = false;
  (pEVar9->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002412d0;
  pEVar9->initializer = &local_58->super_ExprBase;
  pEVar9->condition = pEVar6;
  pEVar9->increment = pEVar7;
  pEVar9->body = pEVar8;
  return pEVar9;
}

Assistant:

ExprFor* AnalyzeFor(ExpressionContext &ctx, SynFor *syntax)
{
	ctx.PushLoopScope(false, false);

	ExprBase *initializer = NULL;

	if(SynBlock *block = getType<SynBlock>(syntax->initializer))
		initializer = AnalyzeBlock(ctx, block, false);
	else if(syntax->initializer)
		initializer = AnalyzeStatement(ctx, syntax->initializer);
	else
		initializer = new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	condition = CreateConditionCast(ctx, condition->source, condition);

	ctx.scope->breakDepth++;
	ctx.scope->contiueDepth++;

	ExprBase *increment = syntax->increment ? AnalyzeStatement(ctx, syntax->increment) : new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);
	ExprBase *body = syntax->body ? AnalyzeStatement(ctx, syntax->body) : new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

	IntrusiveList<ExprBase> iteration;

	if(ExprBase *closures = CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope))
		iteration.push_back(closures);

	iteration.push_back(increment);

	ExprBlock *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, iteration, NULL);

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprFor>()) ExprFor(syntax, ctx.typeVoid, initializer, condition, block, body);
}